

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_stroke_circle
               (nk_draw_list *list,nk_vec2 center,float radius,nk_color col,uint segs,
               float thickness)

{
  if (0xffffff < (uint)col && list != (nk_draw_list *)0x0) {
    nk_draw_list_path_arc_to
              (list,center,radius,0.0,(((float)segs + -1.0) * 6.2831855) / (float)segs,segs);
    nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_circle(struct nk_draw_list *list, struct nk_vec2 center,
float radius, struct nk_color col, unsigned int segs, float thickness)
{
float a_max;
NK_ASSERT(list);
if (!list || !col.a) return;
a_max = NK_PI * 2.0f * ((float)segs - 1.0f) / (float)segs;
nk_draw_list_path_arc_to(list, center, radius, 0.0f, a_max, segs);
nk_draw_list_path_stroke(list, col, NK_STROKE_CLOSED, thickness);
}